

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refmap.c
# Opt level: O0

int flatcc_refmap_resize(flatcc_refmap_t *refmap,size_t count)

{
  flatcc_refmap_item *__ptr;
  ulong uVar1;
  size_t sVar2;
  flatcc_refmap_item *pfVar3;
  flatcc_refmap_item *T_old;
  size_t buckets_old;
  size_t buckets;
  size_t i;
  size_t min_buckets;
  size_t count_local;
  flatcc_refmap_t *refmap_local;
  
  min_buckets = count;
  if (count < refmap->count) {
    min_buckets = refmap->count;
  }
  buckets_old = 8;
  while (sVar2 = _flatcc_refmap_above_load_factor(min_buckets,buckets_old), sVar2 != 0) {
    buckets_old = buckets_old << 1;
  }
  if (refmap->buckets != buckets_old) {
    __ptr = refmap->table;
    uVar1 = refmap->buckets;
    if (buckets_old == 8) {
      memset(refmap->min_table,0,0x80);
      refmap->table = refmap->min_table;
    }
    else {
      pfVar3 = (flatcc_refmap_item *)calloc(buckets_old,0x10);
      refmap->table = pfVar3;
      if (refmap->table == (flatcc_refmap_item *)0x0) {
        refmap->table = __ptr;
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/refmap.c"
                      ,0x69,"int flatcc_refmap_resize(flatcc_refmap_t *, size_t)");
      }
    }
    refmap->buckets = buckets_old;
    refmap->count = 0;
    for (buckets = 0; buckets < uVar1; buckets = buckets + 1) {
      if (__ptr[buckets].src != (void *)0x0) {
        flatcc_refmap_insert(refmap,__ptr[buckets].src,__ptr[buckets].ref);
      }
    }
    if ((__ptr != (flatcc_refmap_item *)0x0) && (__ptr != refmap->min_table)) {
      free(__ptr);
    }
  }
  return 0;
}

Assistant:

int flatcc_refmap_resize(flatcc_refmap_t *refmap, size_t count)
{
    const size_t min_buckets = sizeof(refmap->min_table) / sizeof(refmap->min_table[0]);

    size_t i;
    size_t buckets;
    size_t buckets_old;
    struct flatcc_refmap_item *T_old;

    if (count < refmap->count) {
        count = refmap->count;
    }
    buckets = min_buckets;

    while (_flatcc_refmap_above_load_factor(count, buckets)) {
        buckets *= 2;
    }
    if (refmap->buckets == buckets) {
        return 0;
    }
    T_old = refmap->table;
    buckets_old = refmap->buckets;
    if (buckets == min_buckets) {
        memset(refmap->min_table, 0, sizeof(refmap->min_table));
        refmap->table = refmap->min_table;
    } else {
        refmap->table = _flatcc_refmap_calloc(buckets, sizeof(refmap->table[0]));
        if (refmap->table == 0) {
            refmap->table = T_old;
            FLATCC_ASSERT(0); /* out of memory */
            return -1;
        }
    }
    refmap->buckets = buckets;
    refmap->count = 0;
    for (i = 0; i < buckets_old; ++i) {
        if (T_old[i].src) {
            flatcc_refmap_insert(refmap, T_old[i].src, T_old[i].ref);
        }
    }
    if (T_old && T_old != refmap->min_table) {
        _flatcc_refmap_free(T_old);
    }
    return 0;
}